

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O2

EVP_MD * cbs_to_md(CBS *cbs)

{
  size_t __n;
  int iVar1;
  EVP_MD *pEVar2;
  long lVar3;
  
  __n = cbs->len;
  lVar3 = 0;
  do {
    if (lVar3 == 0x70) {
      return (EVP_MD *)0x0;
    }
    if (__n == kMDOIDs[0].oid[lVar3 + 9]) {
      if (kMDOIDs[0].oid[lVar3 + 9] == 0) {
LAB_003916cc:
        pEVar2 = EVP_get_digestbynid(*(int *)(kMDOIDs[0].oid + lVar3 + 0xc));
        return pEVar2;
      }
      iVar1 = bcmp(cbs->data,kMDOIDs[0].oid + lVar3,__n);
      if (iVar1 == 0) goto LAB_003916cc;
    }
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

static const EVP_MD *cbs_to_md(const CBS *cbs) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kMDOIDs); i++) {
    if (CBS_len(cbs) == kMDOIDs[i].oid_len &&
        OPENSSL_memcmp(CBS_data(cbs), kMDOIDs[i].oid, kMDOIDs[i].oid_len) ==
            0) {
      return EVP_get_digestbynid(kMDOIDs[i].nid);
    }
  }

  return NULL;
}